

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

ValueType __thiscall Jinx::Variant::GetValType(Variant *this)

{
  bool bVar1;
  ValueType VVar2;
  Variant v;
  
  if (this->m_type == ValType) {
    VVar2 = (this->field_1).m_valType;
  }
  else {
    Copy(&v,this);
    bVar1 = ConvertTo(&v,ValType);
    VVar2 = Null;
    if (bVar1) {
      VVar2 = GetValType(&v);
    }
    Destroy(&v);
  }
  return VVar2;
}

Assistant:

inline ValueType Variant::GetValType() const
	{
		if (IsValType())
			return m_valType;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::ValType))
			return ValueType::Null;
		return v.GetValType();
	}